

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

bool __thiscall ON_Viewport::ZoomToScreenRect(ON_Viewport *this,int x0,int y0,int x1,int y1)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int x1_00;
  int y1_00;
  double dVar4;
  double dVar5;
  double d;
  double b1;
  double b0;
  double a1;
  double a0;
  double h;
  double w;
  double t1;
  double s1;
  double t0;
  double s0;
  double frus_far;
  double frus_near;
  double frus_top;
  double frus_bottom;
  double frus_right;
  double frus_left;
  ON_3dVector dolly_vector;
  int cy;
  int cx;
  int dy;
  int dx;
  int port_far;
  int port_near;
  int port_top;
  int port_bottom;
  int port_right;
  int port_left;
  int y1_local;
  int x1_local;
  int y0_local;
  int x0_local;
  ON_Viewport *this_local;
  
  port_right = y1;
  port_left = x1;
  y1_local = y0;
  x1_local = x0;
  _y0_local = this;
  bVar1 = GetScreenPort(this,&port_bottom,&port_top,&port_near,&port_far,&dx,&dy);
  if (bVar1) {
    iVar2 = (x1_local + port_left) / 2;
    iVar3 = (y1_local + port_right) / 2;
    x1_00 = (port_bottom + port_top) / 2;
    y1_00 = (port_near + port_far) / 2;
    dolly_vector.z._0_4_ = y1_00;
    dolly_vector.z._4_4_ = x1_00;
    dVar4 = FrustumNear(this);
    dVar5 = FrustumFar(this);
    bVar1 = GetDollyCameraVector
                      (this,iVar2,iVar3,x1_00,y1_00,(dVar4 + dVar5) * 0.5,(ON_3dVector *)&frus_left)
    ;
    if (bVar1) {
      bVar1 = DollyCamera(this,(ON_3dVector *)&frus_left);
      if (bVar1) {
        iVar2 = dolly_vector.z._4_4_ - iVar2;
        iVar3 = dolly_vector.z._0_4_ - iVar3;
        x1_local = iVar2 + x1_local;
        port_left = iVar2 + port_left;
        y1_local = iVar3 + y1_local;
        port_right = iVar3 + port_right;
        bVar1 = GetFrustum(this,&frus_right,&frus_bottom,&frus_top,&frus_near,&frus_far,&s0);
        if (bVar1) {
          bVar1 = GetRelativeScreenCoordinates
                            (port_bottom,port_top,port_near,port_far,true,&x1_local,&y1_local,
                             &port_left,&port_right,&t0,&s1,&t1,&w);
          if (bVar1) {
            dVar4 = frus_bottom - frus_right;
            dVar5 = frus_near - frus_top;
            a1 = (1.0 - t0) * frus_right + t0 * frus_bottom;
            b0 = (1.0 - t1) * frus_right + t1 * frus_bottom;
            b1 = (1.0 - s1) * frus_top + s1 * frus_near;
            d = (1.0 - w) * frus_top + w * frus_near;
            if (-a1 <= b0) {
              a1 = -b0;
            }
            else {
              b0 = -a1;
            }
            if (-b1 <= d) {
              b1 = -d;
            }
            else {
              d = -b1;
            }
            if ((b0 - a1) * dVar5 <= (d - b1) * dVar4) {
              dVar4 = (((d - b1) * dVar4) / dVar5 - (b0 - a1)) * 0.5;
              a1 = a1 - dVar4;
              b0 = dVar4 + b0;
            }
            else {
              dVar4 = (((b0 - a1) * dVar5) / dVar4 - (d - b1)) * 0.5;
              b1 = b1 - dVar4;
              d = dVar4 + d;
            }
            this_local._7_1_ = SetFrustum(this,a1,b0,b1,d,frus_far,s0);
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Viewport::ZoomToScreenRect( int x0, int y0, int x1, int y1 )
{
  int port_left, port_right, port_bottom, port_top, port_near, port_far;
  if ( !GetScreenPort( &port_left, &port_right, 
                       &port_bottom, &port_top, 
                       &port_near, &port_far ) )
    return false;

  // dolly camera sideways so it's looking at center of rectangle
  int dx = (x0+x1)/2;
  int dy = (y0+y1)/2;
  int cx = (port_left+port_right)/2;
  int cy = (port_bottom+port_top)/2;

  ON_3dVector dolly_vector;
  if ( !GetDollyCameraVector( dx, dy, cx, cy, 0.5*(FrustumNear()+FrustumFar()), dolly_vector ) )
    return false;
  if ( !DollyCamera( dolly_vector ) )
    return false;

  // adjust frustum
  dx = cx - dx;
  dy = cy - dy;
  x0 += dx;
  x1 += dx;
  y0 += dy;
  y1 += dy;
  double frus_left, frus_right, frus_bottom, frus_top, frus_near, frus_far;
  if ( !GetFrustum( &frus_left,   &frus_right, 
                     &frus_bottom, &frus_top, 
                     &frus_near,   &frus_far ) )
    return false;
  double s0,t0,s1,t1;
  if ( !GetRelativeScreenCoordinates(port_left, port_right, port_bottom, port_top,
                              true,
                              x0,y0,x1,y1,
                              s0,t0,s1,t1) )
    return false;
  double w = frus_right - frus_left;
  double h = frus_top - frus_bottom;
  double a0 = (1.0-s0)*frus_left   + s0*frus_right;
  double a1 = (1.0-s1)*frus_left   + s1*frus_right;
  double b0 = (1.0-t0)*frus_bottom + t0*frus_top;
  double b1 = (1.0-t1)*frus_bottom + t1*frus_top;
  if ( -a0 > a1 ) a1 = -a0; else a0 = -a1;
  if ( -b0 > b1 ) b1 = -b0; else b0 = -b1;
  double d;
  if ( (b1-b0)*w < (a1-a0)*h ) {
    d = (a1-a0)*h/w;
    d = 0.5*(d - (b1-b0));
    b0 -= d;
    b1 += d;
  }
  else {
    d = (b1-b0)*w/h;
    d = 0.5*(d - (a1-a0));
    a0 -= d;
    a1 += d;
  }

  return SetFrustum( a0, a1, b0, b1, frus_near, frus_far );
}